

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_checksum.cpp
# Opt level: O0

uint16 crnlib::crc16(void *pBuf,size_t len,uint16 crc)

{
  ushort uVar1;
  uint16 r;
  uint16 q;
  uint8 *p;
  uint16 crc_local;
  size_t len_local;
  void *pBuf_local;
  
  crc_local = crc ^ 0xffff;
  p = (uint8 *)pBuf;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    uVar1 = (ushort)*p ^ crc_local >> 8;
    uVar1 = (ushort)((int)(uint)uVar1 >> 4) ^ uVar1;
    crc_local = crc_local << 8 ^ uVar1 ^ uVar1 << 5 ^ uVar1 << 0xc;
    p = p + 1;
  }
  return crc_local ^ 0xffff;
}

Assistant:

uint16 crc16(const void* pBuf, size_t len, uint16 crc) {
  crc = ~crc;

  const uint8* p = reinterpret_cast<const uint8*>(pBuf);
  while (len) {
    const uint16 q = *p++ ^ (crc >> 8);
    crc <<= 8U;
    uint16 r = (q >> 4) ^ q;
    crc ^= r;
    r <<= 5U;
    crc ^= r;
    r <<= 7U;
    crc ^= r;
    len--;
  }

  return static_cast<uint16>(~crc);
}